

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<spirv_cross::Meta::Decoration,_0UL>::clear
          (SmallVector<spirv_cross::Meta::Decoration,_0UL> *this)

{
  Decoration *pDVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  
  if ((this->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size != 0) {
    lVar3 = 0x88;
    uVar4 = 0;
    do {
      pDVar1 = (this->super_VectorView<spirv_cross::Meta::Decoration>).ptr;
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)((long)&(pDVar1->decoration_flags).lower + lVar3));
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)((long)&(pDVar1->alias)._M_dataplus._M_p + lVar3));
      pvVar2 = *(void **)((long)pDVar1 + lVar3 + -0x28);
      if ((void *)((long)pDVar1 + lVar3 + -0x18) != pvVar2) {
        operator_delete(pvVar2);
      }
      pvVar2 = *(void **)((long)pDVar1 + lVar3 + -0x48);
      if ((void *)((long)pDVar1 + lVar3 + -0x38) != pvVar2) {
        operator_delete(pvVar2);
      }
      pvVar2 = *(void **)((long)pDVar1 + lVar3 + -0x68);
      if ((void *)((long)pDVar1 + lVar3 + -0x58) != pvVar2) {
        operator_delete(pvVar2);
      }
      pvVar2 = *(void **)((long)pDVar1 + lVar3 + -0x88);
      if ((void *)((long)pDVar1 + lVar3 + -0x78) != pvVar2) {
        operator_delete(pvVar2);
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x188;
    } while (uVar4 < (this->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size);
  }
  (this->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size = 0;
  return;
}

Assistant:

void clear() SPIRV_CROSS_NOEXCEPT
	{
		for (size_t i = 0; i < this->buffer_size; i++)
			this->ptr[i].~T();
		this->buffer_size = 0;
	}